

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlrole.c
# Opt level: O3

int internalSubset(PROLOG_STATE *state,int tok,char *ptr,char *end,ENCODING *enc)

{
  int iVar1;
  code *pcVar2;
  
  iVar1 = 0;
  switch(tok) {
  case 0xb:
  case 0xd:
  case 0xf:
    goto switchD_004d3f8c_caseD_b;
  case 0xc:
  case 0xe:
    goto switchD_004d3f8c_caseD_c;
  case 0x10:
    iVar1 = (*enc->nameMatchesAscii)(enc,ptr + (long)enc->minBytesPerChar * 2,end,"ENTITY");
    if (iVar1 != 0) {
      pcVar2 = entity0;
LAB_004d409b:
      state->handler = pcVar2;
      return 0;
    }
    iVar1 = (*enc->nameMatchesAscii)(enc,ptr + (long)enc->minBytesPerChar * 2,end,"ATTLIST");
    if (iVar1 != 0) {
      pcVar2 = attlist0;
      goto LAB_004d409b;
    }
    iVar1 = (*enc->nameMatchesAscii)(enc,ptr + (long)enc->minBytesPerChar * 2,end,"ELEMENT");
    if (iVar1 != 0) {
      pcVar2 = element0;
      goto LAB_004d409b;
    }
    iVar1 = (*enc->nameMatchesAscii)(enc,ptr + (long)enc->minBytesPerChar * 2,end,"NOTATION");
    if (iVar1 != 0) {
      pcVar2 = notation0;
      goto LAB_004d409b;
    }
    goto LAB_004d3fe9;
  default:
    if (tok == 0x1a) {
      pcVar2 = doctype5;
      goto LAB_004d409b;
    }
    if (tok == 0x1c) {
      return 0x35;
    }
switchD_004d3f8c_caseD_c:
    if ((tok != 0x1c) || (iVar1 = 0x34, state->documentEntity != 0)) {
LAB_004d3fe9:
      state->handler = error;
      iVar1 = -1;
    }
switchD_004d3f8c_caseD_b:
    return iVar1;
  }
}

Assistant:

static
int internalSubset(PROLOG_STATE *state,
                   int tok,
                   const char *ptr,
                   const char *end,
                   const ENCODING *enc)
{
  switch (tok) {
  case XML_TOK_PROLOG_S:
    return XML_ROLE_NONE;
  case XML_TOK_DECL_OPEN:
    if (XmlNameMatchesAscii(enc,
                            ptr + 2 * MIN_BYTES_PER_CHAR(enc),
                            end,
                            KW_ENTITY)) {
      state->handler = entity0;
      return XML_ROLE_NONE;
    }
    if (XmlNameMatchesAscii(enc,
                            ptr + 2 * MIN_BYTES_PER_CHAR(enc),
                            end,
                            KW_ATTLIST)) {
      state->handler = attlist0;
      return XML_ROLE_NONE;
    }
    if (XmlNameMatchesAscii(enc,
                            ptr + 2 * MIN_BYTES_PER_CHAR(enc),
                            end,
                            KW_ELEMENT)) {
      state->handler = element0;
      return XML_ROLE_NONE;
    }
    if (XmlNameMatchesAscii(enc,
                            ptr + 2 * MIN_BYTES_PER_CHAR(enc),
                            end,
                            KW_NOTATION)) {
      state->handler = notation0;
      return XML_ROLE_NONE;
    }
    break;
  case XML_TOK_PI:
  case XML_TOK_COMMENT:
    return XML_ROLE_NONE;
  case XML_TOK_PARAM_ENTITY_REF:
    return XML_ROLE_PARAM_ENTITY_REF;
  case XML_TOK_CLOSE_BRACKET:
    state->handler = doctype5;
    return XML_ROLE_NONE;
  }
  return common(state, tok);
}